

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmGhsMultiTargetGenerator::WriteSources(cmGhsMultiTargetGenerator *this,ostream *fout_proj)

{
  Types TVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  iterator __position;
  cmGeneratorTarget *pcVar4;
  cmSourceFile *this_00;
  undefined8 uVar5;
  iterator iVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  string *psVar13;
  cmSourceGroup *this_01;
  vector<cmSourceFile*,std::allocator<cmSourceFile*>> *this_02;
  iterator iVar14;
  _Base_ptr p_Var15;
  mapped_type *pmVar16;
  char *pcVar17;
  cmGeneratedFileStream *pcVar18;
  cmCustomCommand *pcVar19;
  ostream *poVar20;
  long *plVar21;
  cmSourceFileLocation *pcVar22;
  ulong *puVar23;
  size_type *psVar24;
  pointer ppcVar25;
  pointer pbVar26;
  uint __len;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  __i;
  ulong uVar27;
  pointer ppcVar28;
  pointer ppcVar29;
  cmGhsMultiTargetGenerator *pcVar30;
  char *pcVar31;
  pointer ppcVar32;
  uint __val;
  long lVar33;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar34;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string fpath;
  cmGeneratedFileStream *f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupFilesList;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  string lpath;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupNames;
  string gn;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardGroups;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  groupFiles;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string local_4d8;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [24];
  cmGeneratedFileStream *local_490;
  _Base_ptr local_488;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_480;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_468;
  _Base_ptr local_448;
  iterator iStack_440;
  _Alloc_hider local_438;
  undefined1 local_428 [8];
  undefined1 local_420 [168];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_378;
  string local_358;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  _Base_ptr local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  string local_2f8;
  undefined1 local_2d8 [32];
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  _Base_ptr local_298 [2];
  undefined1 local_288 [16];
  _Base_ptr local_278;
  undefined1 local_268 [16];
  _Alloc_hider local_258;
  char local_248 [16];
  long *local_238 [2];
  long local_228 [51];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  local_78;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_48;
  
  local_378.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (cmSourceFile **)0x0;
  local_378.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (cmSourceFile **)0x0;
  local_378.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_490 = (cmGeneratedFileStream *)fout_proj;
  cmGeneratorTarget::GetSourceFiles(this->GeneratorTarget,&local_378,&this->ConfigName);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            (&local_48,&this->Makefile->SourceGroups);
  ppcVar29 = local_378.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_338._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_338._M_impl.super__Rb_tree_header._M_header;
  local_338._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_338._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_338._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_338._M_impl.super__Rb_tree_header._M_header._M_right =
       local_338._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_378.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_378.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar25 = local_378.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    do {
      pcVar2 = this->Makefile;
      psVar13 = cmSourceFile::GetFullPath(*ppcVar25,(string *)0x0);
      this_01 = cmMakefile::FindSourceGroup(pcVar2,psVar13,&local_48);
      psVar13 = cmSourceGroup::GetFullName_abi_cxx11_(this_01);
      pcVar3 = (psVar13->_M_dataplus)._M_p;
      local_2d8._0_8_ = local_2d8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2d8,pcVar3,pcVar3 + psVar13->_M_string_length);
      this_02 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_78,(key_type *)local_2d8);
      __position._M_current = *(cmSourceFile ***)(this_02 + 8);
      if (__position._M_current == *(cmSourceFile ***)(this_02 + 0x10)) {
        std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
        _M_realloc_insert<cmSourceFile*const&>(this_02,__position,ppcVar25);
      }
      else {
        *__position._M_current = *ppcVar25;
        *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_338,(key_type *)local_2d8);
      if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
        operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
      }
      ppcVar25 = ppcVar25 + 1;
    } while (ppcVar25 != ppcVar29);
  }
  local_2d8._0_8_ = local_2d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"CMake Rules","");
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Header Files","");
  local_298[0] = (_Base_ptr)local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"Source Files","");
  local_278 = (_Base_ptr)local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Object Files","");
  local_258._M_p = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Object Libraries","");
  plVar21 = local_228;
  local_238[0] = plVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Resources","");
  __l._M_len = 6;
  __l._M_array = (iterator)local_2d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90,__l,(allocator_type *)local_420);
  lVar33 = -0xc0;
  do {
    if (plVar21 != (long *)plVar21[-2]) {
      operator_delete((long *)plVar21[-2],*plVar21 + 1);
    }
    plVar21 = plVar21 + -4;
    lVar33 = lVar33 + 0x20;
  } while (lVar33 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_480,local_78._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)local_2d8);
  uVar27 = 0;
  if (local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar26 = local_90.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar14 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_338,pbVar26);
      iVar11 = (int)uVar27;
      if ((_Rb_tree_header *)iVar14._M_node == &local_338._M_impl.super__Rb_tree_header) {
        if ((this->TagType == CUSTOM_TARGET) &&
           (iVar10 = std::__cxx11::string::compare((char *)pbVar26), iVar10 == 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_480,
                   ((long)local_480.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_480.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
          std::__cxx11::string::_M_assign
                    ((string *)
                     (local_480.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar11));
          goto LAB_002248b4;
        }
      }
      else {
        std::__cxx11::string::_M_assign
                  ((string *)
                   (local_480.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar11));
        pVar34 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::equal_range(&local_338,pbVar26);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_aux(&local_338,(_Base_ptr)pVar34.first._M_node,(_Base_ptr)pVar34.second._M_node);
LAB_002248b4:
        uVar27 = (ulong)(iVar11 + 1);
      }
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 !=
             local_90.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    uVar27 = (ulong)(int)uVar27;
  }
  local_2d8._0_8_ = local_2d8 + 0x10;
  local_2d8._8_8_ = (cmGeneratorTarget *)0x0;
  local_2d8._16_8_ = local_2d8._16_8_ & 0xffffffffffffff00;
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&local_338,(key_type *)local_2d8);
  if ((_Rb_tree_header *)iVar14._M_node != &local_338._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               (local_480.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    pVar34 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::equal_range(&local_338,(key_type *)local_2d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_aux(&local_338,(_Base_ptr)pVar34.first._M_node,(_Base_ptr)pVar34.second._M_node);
  }
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  if ((_Rb_tree_header *)local_338._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_338._M_impl.super__Rb_tree_header) {
    lVar33 = uVar27 << 5;
    p_Var15 = local_338._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_480.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar33));
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      lVar33 = lVar33 + 0x20;
    } while ((_Rb_tree_header *)p_Var15 != &local_338._M_impl.super__Rb_tree_header);
  }
  pbVar26 = local_480.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  p_Var15 = (_Base_ptr)
            local_480.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_480.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_480.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_78,(key_type *)p_Var15);
      ppcVar29 = (pmVar16->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_78,(key_type *)p_Var15);
      ppcVar25 = (pmVar16->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppcVar29 != ppcVar25) {
        uVar27 = (long)ppcVar25 - (long)ppcVar29 >> 3;
        lVar33 = 0x3f;
        if (uVar27 != 0) {
          for (; uVar27 >> lVar33 == 0; lVar33 = lVar33 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar29,ppcVar25,((uint)lVar33 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)ppcVar25 - (long)ppcVar29 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar29,ppcVar25);
        }
        else {
          ppcVar28 = ppcVar29 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar29,ppcVar28);
          for (; ppcVar28 != ppcVar25; ppcVar28 = ppcVar28 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                      (ppcVar28);
          }
        }
      }
      p_Var15 = p_Var15 + 1;
    } while (p_Var15 != (_Base_ptr)pbVar26);
    local_448 = (_Base_ptr)0x0;
    iStack_440._M_current = (cmGeneratedFileStream **)0x0;
    local_438._M_p = (pointer)0x0;
    local_308 = (_Base_ptr)
                local_480.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_480.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_480.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_488 = (_Base_ptr)
                  local_480.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_300 = &this->Name;
      do {
        pcVar31 = local_420 + 0x10;
        pcVar4 = this->GeneratorTarget;
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2d8,"GHS_NO_SOURCE_GROUP_FILE","");
        pcVar17 = cmGeneratorTarget::GetProperty(pcVar4,(string *)local_2d8);
        bVar8 = cmSystemTools::IsOn(pcVar17);
        bVar9 = true;
        if (!bVar8) {
          pcVar2 = this->Makefile;
          local_420._0_8_ = pcVar31;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_420,"CMAKE_GHS_NO_SOURCE_GROUP_FILE","");
          pcVar17 = cmMakefile::GetDefinition(pcVar2,(string *)local_420);
          bVar9 = cmSystemTools::IsOn(pcVar17);
          if ((char *)local_420._0_8_ != pcVar31) {
            operator_delete((void *)local_420._0_8_,CONCAT71(local_420._17_7_,local_420[0x10]) + 1);
          }
        }
        if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        p_Var15 = local_488->_M_parent;
        if (bVar9 == false) {
          local_4a8._16_8_ = local_490;
          if (p_Var15 != (_Base_ptr)0x0) {
            local_2d8._0_8_ = local_2d8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2d8,*(long *)local_488,
                       (long)&p_Var15->_M_color + *(long *)local_488);
            cmsys::SystemTools::ReplaceString((string *)local_2d8,"\\","_");
            (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                      (local_420,this->LocalGenerator,this->GeneratorTarget);
            std::__cxx11::string::append(local_420);
            std::__cxx11::string::_M_append(local_420,local_2d8._0_8_);
            std::__cxx11::string::append(local_420);
            psVar13 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                (&this->LocalGenerator->super_cmLocalGenerator);
            local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
            pcVar3 = (psVar13->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4d8,pcVar3,pcVar3 + psVar13->_M_string_length);
            std::__cxx11::string::append((char *)&local_4d8);
            std::__cxx11::string::_M_append((char *)&local_4d8,local_420._0_8_);
            pcVar18 = (cmGeneratedFileStream *)operator_new(0x248);
            cmGeneratedFileStream::cmGeneratedFileStream(pcVar18,&local_4d8,false,None);
            local_4b8._0_8_ = pcVar18;
            cmGeneratedFileStream::SetCopyIfDifferent(pcVar18,true);
            if (iStack_440._M_current == (cmGeneratedFileStream **)local_438._M_p) {
              std::vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>::
              _M_realloc_insert<cmGeneratedFileStream*const&>
                        ((vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>> *)
                         &local_448,iStack_440,(cmGeneratedFileStream **)local_4b8);
            }
            else {
              *iStack_440._M_current = (cmGeneratedFileStream *)local_4b8._0_8_;
              iStack_440._M_current = iStack_440._M_current + 1;
            }
            local_4a8._16_8_ = local_4b8._0_8_;
            cmGlobalGhsMultiGenerator::WriteFileHeader
                      ((cmGlobalGhsMultiGenerator *)
                       (this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,
                       (ostream *)local_4b8._0_8_);
            GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)local_4b8._0_8_);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_490,(char *)local_420._0_8_,local_420._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
            GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)local_490);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
              operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((char *)local_420._0_8_ != pcVar31) {
              operator_delete((void *)local_420._0_8_,CONCAT71(local_420._17_7_,local_420[0x10]) + 1
                             );
            }
            if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
              operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
            }
            if (local_488->_M_parent != (_Base_ptr)0x0) goto LAB_00224eca;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4a8._16_8_,"{comment} Others",0x10);
          std::ios::widen((char)(((ofstream *)local_4a8._16_8_)->
                                super_basic_ostream<char,_std::char_traits<char>_>).
                                _vptr_basic_ostream[-3] + (char)local_4a8._16_8_);
          std::ostream::put((char)local_4a8._16_8_);
          std::ostream::flush();
        }
        else {
          if (p_Var15 == (_Base_ptr)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_490,"{comment} Others",0x10);
            std::ios::widen((char)(local_490->super_ofstream).
                                  super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream[-3] + (char)local_490);
            pcVar18 = local_490;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_490,"{comment} ",10)
            ;
            pcVar18 = (cmGeneratedFileStream *)
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_490,*(char **)local_488,(long)local_488->_M_parent
                                );
            std::ios::widen((char)(pcVar18->super_ofstream).
                                  super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream[-3] + (char)pcVar18);
          }
          std::ostream::put((char)pcVar18);
          std::ostream::flush();
          local_4a8._16_8_ = local_490;
        }
LAB_00224eca:
        p_Var15 = local_488;
        iVar11 = std::__cxx11::string::compare((char *)local_488);
        if (iVar11 == 0) {
          local_468.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_468.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_468.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar8 = ComputeCustomCommandOrder(this,&local_468);
          if (bVar8) {
            psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_420,"The custom commands for target [",psVar13);
            plVar21 = (long *)std::__cxx11::string::append((char *)local_420);
            local_2d8._0_8_ = local_2d8 + 0x10;
            puVar23 = (ulong *)(plVar21 + 2);
            if ((ulong *)*plVar21 == puVar23) {
              local_2d8._16_8_ = *puVar23;
              local_2d8._24_8_ = plVar21[3];
            }
            else {
              local_2d8._16_8_ = *puVar23;
              local_2d8._0_8_ = (ulong *)*plVar21;
            }
            local_2d8._8_8_ = plVar21[1];
            *plVar21 = (long)puVar23;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            if ((char *)local_420._0_8_ != pcVar31) {
              operator_delete((void *)local_420._0_8_,CONCAT71(local_420._17_7_,local_420[0x10]) + 1
                             );
            }
            cmSystemTools::Error((string *)local_2d8);
            if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
              operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
            }
          }
          else {
            ppcVar29 = local_468.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppcVar32 = local_468.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            if (local_468.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_468.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              do {
                pcVar22 = cmSourceFile::GetLocation(*ppcVar32);
                local_2d8._0_8_ = local_2d8 + 0x10;
                pcVar3 = (this->Name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_2d8,pcVar3,pcVar3 + (this->Name)._M_string_length);
                std::__cxx11::string::append((char *)local_2d8);
                uVar5 = local_2d8._0_8_;
                pcVar4 = (cmGeneratorTarget *)(pcVar22->Name)._M_string_length;
                if (pcVar4 == (cmGeneratorTarget *)local_2d8._8_8_) {
                  if (pcVar4 == (cmGeneratorTarget *)0x0) {
                    bVar8 = true;
                  }
                  else {
                    iVar11 = bcmp((pcVar22->Name)._M_dataplus._M_p,(void *)local_2d8._0_8_,
                                  (size_t)pcVar4);
                    bVar8 = iVar11 == 0;
                  }
                }
                else {
                  bVar8 = false;
                }
                if ((undefined1 *)uVar5 != local_2d8 + 0x10) {
                  operator_delete((void *)uVar5,local_2d8._16_8_ + 1);
                }
                ppcVar29 = ppcVar32 + 1;
                if (bVar8) {
                  std::_V2::
                  __rotate<__gnu_cxx::__normal_iterator<cmSourceFile_const**,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>>
                            (ppcVar32);
                  ppcVar29 = local_468.
                             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  break;
                }
                ppcVar32 = ppcVar29;
              } while (ppcVar29 !=
                       local_468.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (local_468.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start != ppcVar29) {
              __val = 0;
              ppcVar32 = local_468.
                         super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              local_428 = (undefined1  [8])ppcVar29;
              do {
                pcVar19 = cmSourceFile::GetCustomCommand(*ppcVar32);
                local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                pcVar3 = (this->ConfigName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_358,pcVar3,pcVar3 + (this->ConfigName)._M_string_length)
                ;
                cmCustomCommandGenerator::cmCustomCommandGenerator
                          ((cmCustomCommandGenerator *)local_420,pcVar19,&local_358,
                           &this->LocalGenerator->super_cmLocalGenerator);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_358._M_dataplus._M_p != &local_358.field_2) {
                  operator_delete(local_358._M_dataplus._M_p,
                                  local_358.field_2._M_allocated_capacity + 1);
                }
                psVar13 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                    (&this->LocalGenerator->super_cmLocalGenerator);
                local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                pcVar3 = (psVar13->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4d8,pcVar3,pcVar3 + psVar13->_M_string_length);
                (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b8,this->LocalGenerator,this->GeneratorTarget);
                plVar21 = (long *)std::__cxx11::string::replace
                                            ((ulong)local_4b8,0,(char *)0x0,0x5372ad);
                local_2d8._0_8_ = local_2d8 + 0x10;
                psVar24 = (size_type *)(plVar21 + 2);
                if ((size_type *)*plVar21 == psVar24) {
                  local_2d8._16_8_ = *psVar24;
                  local_2d8._24_8_ = plVar21[3];
                }
                else {
                  local_2d8._16_8_ = *psVar24;
                  local_2d8._0_8_ = (size_type *)*plVar21;
                }
                local_2d8._8_8_ = plVar21[1];
                *plVar21 = (long)psVar24;
                plVar21[1] = 0;
                *(undefined1 *)(plVar21 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_4d8,local_2d8._0_8_);
                if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                  operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                }
                if ((cmGeneratedFileStream *)local_4b8._0_8_ != (cmGeneratedFileStream *)local_4a8)
                {
                  operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4b8,"/",local_300);
                plVar21 = (long *)std::__cxx11::string::append((char *)local_4b8);
                local_2d8._0_8_ = local_2d8 + 0x10;
                psVar24 = (size_type *)(plVar21 + 2);
                if ((size_type *)*plVar21 == psVar24) {
                  local_2d8._16_8_ = *psVar24;
                  local_2d8._24_8_ = plVar21[3];
                }
                else {
                  local_2d8._16_8_ = *psVar24;
                  local_2d8._0_8_ = (size_type *)*plVar21;
                }
                local_2d8._8_8_ = plVar21[1];
                *plVar21 = (long)psVar24;
                plVar21[1] = 0;
                *(undefined1 *)(plVar21 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_4d8,local_2d8._0_8_);
                if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                  operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                }
                if ((cmGeneratedFileStream *)local_4b8._0_8_ != (cmGeneratedFileStream *)local_4a8)
                {
                  operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
                }
                __len = 1;
                if (9 < __val) {
                  uVar27 = (ulong)__val;
                  uVar7 = 4;
                  do {
                    __len = uVar7;
                    uVar12 = (uint)uVar27;
                    if (uVar12 < 100) {
                      __len = __len - 2;
                      goto LAB_0022582b;
                    }
                    if (uVar12 < 1000) {
                      __len = __len - 1;
                      goto LAB_0022582b;
                    }
                    if (uVar12 < 10000) goto LAB_0022582b;
                    uVar27 = uVar27 / 10000;
                    uVar7 = __len + 4;
                  } while (99999 < uVar12);
                  __len = __len + 1;
                }
LAB_0022582b:
                local_4b8._0_8_ = local_4a8;
                std::__cxx11::string::_M_construct((ulong)local_4b8,(char)__len);
                std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4b8._0_8_,__len,__val)
                ;
                plVar21 = (long *)std::__cxx11::string::append(local_4b8);
                local_2d8._0_8_ = local_2d8 + 0x10;
                puVar23 = (ulong *)(plVar21 + 2);
                if ((ulong *)*plVar21 == puVar23) {
                  local_2d8._16_8_ = *puVar23;
                  local_2d8._24_8_ = plVar21[3];
                }
                else {
                  local_2d8._16_8_ = *puVar23;
                  local_2d8._0_8_ = (ulong *)*plVar21;
                }
                local_2d8._8_8_ = plVar21[1];
                *plVar21 = (long)puVar23;
                plVar21[1] = 0;
                *(undefined1 *)(plVar21 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_4d8,local_2d8._0_8_);
                if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                  operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                }
                if ((cmGeneratedFileStream *)local_4b8._0_8_ != (cmGeneratedFileStream *)local_4a8)
                {
                  operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
                }
                pcVar22 = cmSourceFile::GetLocation(*ppcVar32);
                std::__cxx11::string::_M_append
                          ((char *)&local_4d8,(ulong)(pcVar22->Name)._M_dataplus._M_p);
                std::__cxx11::string::append((char *)&local_4d8);
                cmGeneratedFileStream::cmGeneratedFileStream
                          ((cmGeneratedFileStream *)local_2d8,&local_4d8,false,None);
                cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2d8,true);
                WriteCustomCommandsHelper
                          (this,(ostream *)local_2d8,(cmCustomCommandGenerator *)local_420);
                pcVar30 = (cmGhsMultiTargetGenerator *)local_2d8;
                cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_2d8);
                WriteCustomCommandLine
                          (pcVar30,(ostream *)local_4a8._16_8_,&local_4d8,
                           (cmCustomCommandGenerator *)local_420);
                cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                  operator_delete(local_4d8._M_dataplus._M_p,
                                  local_4d8.field_2._M_allocated_capacity + 1);
                }
                __val = __val + 1;
                cmCustomCommandGenerator::~cmCustomCommandGenerator
                          ((cmCustomCommandGenerator *)local_420);
                ppcVar32 = ppcVar32 + 1;
              } while ((undefined1  [8])ppcVar32 != local_428);
            }
          }
          if (this->TagType == CUSTOM_TARGET) {
            WriteBuildEvents(this,(ostream *)local_4a8._16_8_);
          }
          if (local_468.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_468.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_468.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_468.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                                  *)&local_78,(key_type *)p_Var15);
          ppcVar29 = (pmVar16->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          local_428 = (undefined1  [8])
                      (pmVar16->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish;
          if ((undefined1  [8])ppcVar29 != local_428) {
            do {
              this_00 = *ppcVar29;
              psVar13 = cmSourceFile::GetFullPath_abi_cxx11_(this_00);
              local_2d8._0_8_ = local_2d8 + 0x10;
              pcVar3 = (psVar13->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2d8,pcVar3,pcVar3 + psVar13->_M_string_length);
              cmSystemTools::ConvertToOutputSlashes((string *)local_2d8);
              local_420._8_8_ = (char *)0x0;
              local_420[0x10] = '\0';
              TVar1 = this->TagType;
              local_420._0_8_ = local_420 + 0x10;
              if (TVar1 == CUSTOM_TARGET) {
                cmSourceFile::GetLanguage_abi_cxx11_(&local_2f8,this_00);
                bVar8 = true;
                if (local_2f8._M_string_length == 0) goto LAB_00224f93;
LAB_00224fa8:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                  operator_delete(local_2f8._M_dataplus._M_p,
                                  local_2f8.field_2._M_allocated_capacity + 1);
                }
                if (bVar8) goto LAB_00224fdc;
LAB_00224fd2:
                bVar8 = false;
              }
              else {
LAB_00224f93:
                pcVar19 = cmSourceFile::GetCustomCommand(this_00);
                bVar8 = pcVar19 != (cmCustomCommand *)0x0;
                if (TVar1 == CUSTOM_TARGET) goto LAB_00224fa8;
                if (pcVar19 == (cmCustomCommand *)0x0) goto LAB_00224fd2;
LAB_00224fdc:
                bVar8 = true;
                std::__cxx11::string::_M_replace
                          ((ulong)local_420,0,(char *)local_420._8_8_,0x4ed0eb);
              }
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4a8._16_8_,(char *)local_420._0_8_,
                                   local_420._8_8_);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar20,(char *)local_2d8._0_8_,local_2d8._8_8_);
              std::ios::widen((char)poVar20->_vptr_basic_ostream[-3] + (char)poVar20);
              std::ostream::put((char)poVar20);
              std::ostream::flush();
              if (!bVar8) {
                psVar13 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
                iVar11 = std::__cxx11::string::compare((char *)psVar13);
                if (iVar11 != 0) {
                  psVar13 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
                  iVar11 = std::__cxx11::string::compare((char *)psVar13);
                  if (iVar11 != 0) {
                    psVar13 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
                    iVar11 = std::__cxx11::string::compare((char *)psVar13);
                    if (iVar11 != 0) {
                      WriteObjectLangOverride((ostream *)local_4a8._16_8_,this_00);
                    }
                  }
                }
                local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_4d8,"INCLUDE_DIRECTORIES","");
                local_4b8._0_8_ = local_4a8;
                pcVar30 = (cmGhsMultiTargetGenerator *)local_4b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"-I","");
                uVar5 = local_4a8._16_8_;
                WriteSourceProperty(pcVar30,(ostream *)local_4a8._16_8_,this_00,&local_4d8,
                                    (string *)local_4b8);
                if ((cmGeneratedFileStream *)local_4b8._0_8_ != (cmGeneratedFileStream *)local_4a8)
                {
                  operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                  operator_delete(local_4d8._M_dataplus._M_p,
                                  local_4d8.field_2._M_allocated_capacity + 1);
                }
                local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_4d8,"COMPILE_DEFINITIONS","");
                local_4b8._0_8_ = local_4a8;
                pcVar30 = (cmGhsMultiTargetGenerator *)local_4b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"-D","");
                WriteSourceProperty(pcVar30,(ostream *)uVar5,this_00,&local_4d8,(string *)local_4b8)
                ;
                if ((cmGeneratedFileStream *)local_4b8._0_8_ != (cmGeneratedFileStream *)local_4a8)
                {
                  operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                  operator_delete(local_4d8._M_dataplus._M_p,
                                  local_4d8.field_2._M_allocated_capacity + 1);
                }
                local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_4d8,"COMPILE_OPTIONS","");
                local_4b8._0_8_ = local_4a8;
                pcVar30 = (cmGhsMultiTargetGenerator *)local_4b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"");
                WriteSourceProperty(pcVar30,(ostream *)uVar5,this_00,&local_4d8,(string *)local_4b8)
                ;
                if ((cmGeneratedFileStream *)local_4b8._0_8_ != (cmGeneratedFileStream *)local_4a8)
                {
                  operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                  operator_delete(local_4d8._M_dataplus._M_p,
                                  local_4d8.field_2._M_allocated_capacity + 1);
                }
                psVar13 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GeneratorTarget,this_00)
                ;
                local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
                pcVar3 = (psVar13->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4d8,pcVar3,pcVar3 + psVar13->_M_string_length);
                if ((local_4d8._M_string_length != 0) &&
                   (bVar8 = cmGeneratorTarget::HasExplicitObjectName(this->GeneratorTarget,this_00),
                   bVar8)) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)uVar5,"    -o ",7);
                  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)uVar5,local_4d8._M_dataplus._M_p,
                                       local_4d8._M_string_length);
                  std::ios::widen((char)poVar20->_vptr_basic_ostream[-3] + (char)poVar20);
                  std::ostream::put((char)poVar20);
                  std::ostream::flush();
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                  operator_delete(local_4d8._M_dataplus._M_p,
                                  local_4d8.field_2._M_allocated_capacity + 1);
                }
              }
              if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
                operator_delete((void *)local_420._0_8_,
                                CONCAT71(local_420._17_7_,local_420[0x10]) + 1);
              }
              if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
              }
              ppcVar29 = ppcVar29 + 1;
            } while ((undefined1  [8])ppcVar29 != local_428);
          }
        }
        iVar6._M_current = iStack_440._M_current;
        local_488 = local_488 + 1;
        p_Var15 = local_448;
      } while (local_488 != local_308);
      for (; p_Var15 != (_Base_ptr)iVar6._M_current; p_Var15 = (_Base_ptr)&p_Var15->_M_parent) {
        cmGeneratedFileStream::Close(*(cmGeneratedFileStream **)p_Var15);
      }
      if (local_448 != (_Base_ptr)0x0) {
        operator_delete(local_448,(long)local_438._M_p - (long)local_448);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_480);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_338);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::~_Rb_tree(&local_78);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&local_48);
  if (local_378.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (cmSourceFile **)0x0) {
    operator_delete(local_378.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_378.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSources(std::ostream& fout_proj)
{
  /* vector of all sources for this target */
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);

  /* vector of all groups defined for this target
   * -- but the vector is not expanded with sub groups or in any useful order
   */
  std::vector<cmSourceGroup> sourceGroups = this->Makefile->GetSourceGroups();

  /* for each source file assign it to its group */
  std::map<std::string, std::vector<cmSourceFile*>> groupFiles;
  std::set<std::string> groupNames;
  for (auto& sf : sources) {
    cmSourceGroup* sourceGroup =
      this->Makefile->FindSourceGroup(sf->GetFullPath(), sourceGroups);
    std::string gn = sourceGroup->GetFullName();
    groupFiles[gn].push_back(sf);
    groupNames.insert(std::move(gn));
  }

  /* list of known groups and the order they are displayed in a project file */
  const std::vector<std::string> standardGroups = {
    "CMake Rules",  "Header Files",     "Source Files",
    "Object Files", "Object Libraries", "Resources"
  };

  /* list of groups in the order they are displayed in a project file*/
  std::vector<std::string> groupFilesList(groupFiles.size());

  /* put the groups in the order they should be listed
   * - standard groups first, and then everything else
   *   in the order used by std::map.
   */
  int i = 0;
  for (const std::string& gn : standardGroups) {
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList[i] = *n;
      i += 1;
      groupNames.erase(gn);
    } else if (this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
               gn == "CMake Rules") {
      /* make sure that rules folder always exists in case of custom targets
       * that have no custom commands except for pre or post build events.
       */
      groupFilesList.resize(groupFilesList.size() + 1);
      groupFilesList[i] = gn;
      i += 1;
    }
  }

  { /* catch-all group - is last item */
    std::string gn;
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList.back() = *n;
      groupNames.erase(gn);
    }
  }

  for (auto& n : groupNames) {
    groupFilesList[i] = n;
    i += 1;
  }

  /* sort the files within each group */
  for (auto& n : groupFilesList) {
    std::sort(groupFiles[n].begin(), groupFiles[n].end(),
              [](cmSourceFile* l, cmSourceFile* r) {
                return l->GetFullPath() < r->GetFullPath();
              });
  }

  /* list of open project files */
  std::vector<cmGeneratedFileStream*> gfiles;

  /* write files into the proper project file
   * -- groups go into main project file
   *    unless NO_SOURCE_GROUP_FILE property or variable is set.
   */
  for (auto& sg : groupFilesList) {
    std::ostream* fout;
    bool useProjectFile =
      cmSystemTools::IsOn(
        this->GeneratorTarget->GetProperty("GHS_NO_SOURCE_GROUP_FILE")) ||
      cmSystemTools::IsOn(
        this->Makefile->GetDefinition("CMAKE_GHS_NO_SOURCE_GROUP_FILE"));
    if (useProjectFile || sg.empty()) {
      fout = &fout_proj;
    } else {
      // Open the filestream in copy-if-different mode.
      std::string gname = sg;
      cmsys::SystemTools::ReplaceString(gname, "\\", "_");
      std::string lpath =
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
      lpath += "/";
      lpath += gname;
      lpath += cmGlobalGhsMultiGenerator::FILE_EXTENSION;
      std::string fpath = this->LocalGenerator->GetCurrentBinaryDirectory();
      fpath += "/";
      fpath += lpath;
      cmGeneratedFileStream* f = new cmGeneratedFileStream(fpath);
      f->SetCopyIfDifferent(true);
      gfiles.push_back(f);
      fout = f;
      this->GetGlobalGenerator()->WriteFileHeader(*f);
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, *f);
      fout_proj << lpath << " ";
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, fout_proj);
    }

    if (useProjectFile) {
      if (sg.empty()) {
        *fout << "{comment} Others" << std::endl;
      } else {
        *fout << "{comment} " << sg << std::endl;
      }
    } else if (sg.empty()) {
      *fout << "{comment} Others" << std::endl;
    }

    if (sg != "CMake Rules") {
      /* output rule for each source file */
      for (const cmSourceFile* si : groupFiles[sg]) {
        bool compile = true;
        // Convert filename to native system
        // WORKAROUND: GHS MULTI 6.1.4 and 6.1.6 are known to need backslash on
        // windows when opening some files from the search window.
        std::string fname(si->GetFullPath());
        cmSystemTools::ConvertToOutputSlashes(fname);

        /* For custom targets list any associated sources,
         * comment out source code to prevent it from being
         * compiled when processing this target.
         * Otherwise, comment out any custom command (main) dependencies that
         * are listed as source files to prevent them from being considered
         * part of the build.
         */
        std::string comment;
        if ((this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
             !si->GetLanguage().empty()) ||
            si->GetCustomCommand()) {
          comment = "{comment} ";
          compile = false;
        }

        *fout << comment << fname << std::endl;
        if (compile) {
          if ("ld" != si->GetExtension() && "int" != si->GetExtension() &&
              "bsp" != si->GetExtension()) {
            WriteObjectLangOverride(*fout, si);
          }

          this->WriteSourceProperty(*fout, si, "INCLUDE_DIRECTORIES", "-I");
          this->WriteSourceProperty(*fout, si, "COMPILE_DEFINITIONS", "-D");
          this->WriteSourceProperty(*fout, si, "COMPILE_OPTIONS", "");

          /* to avoid clutter in the GUI only print out the objectName if it
           * has been renamed */
          std::string objectName = this->GeneratorTarget->GetObjectName(si);
          if (!objectName.empty() &&
              this->GeneratorTarget->HasExplicitObjectName(si)) {
            *fout << "    -o " << objectName << std::endl;
          }
        }
      }
    } else {
      std::vector<cmSourceFile const*> customCommands;
      if (ComputeCustomCommandOrder(customCommands)) {
        std::string message = "The custom commands for target [" +
          this->GeneratorTarget->GetName() + "] had a cycle.\n";
        cmSystemTools::Error(message);
      } else {
        /* Custom targets do not have a dependency on SOURCES files.
         * Therefore the dependency list may include SOURCES files after the
         * custom target. Because nothing can depend on the custom target just
         * move it to the last item.
         */
        for (auto sf = customCommands.begin(); sf != customCommands.end();
             ++sf) {
          if (((*sf)->GetLocation()).GetName() == this->Name + ".rule") {
            std::rotate(sf, sf + 1, customCommands.end());
            break;
          }
        }
        int cmdcount = 0;
        for (auto& sf : customCommands) {
          const cmCustomCommand* cc = sf->GetCustomCommand();
          cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                       this->LocalGenerator);

          // Open the filestream for this custom command
          std::string fname =
            this->LocalGenerator->GetCurrentBinaryDirectory();
          fname += "/" +
            this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
          fname += "/" + this->Name + "_cc";
          fname += std::to_string(cmdcount++) + "_";
          fname += (sf->GetLocation()).GetName();
          fname += this->CmdWindowsShell ? ".bat" : ".sh";
          cmGeneratedFileStream f(fname);
          f.SetCopyIfDifferent(true);
          this->WriteCustomCommandsHelper(f, ccg);
          f.Close();
          this->WriteCustomCommandLine(*fout, fname, ccg);
        }
      }
      if (this->TagType == GhsMultiGpj::CUSTOM_TARGET) {
        this->WriteBuildEvents(*fout);
      }
    }
  }

  for (cmGeneratedFileStream* f : gfiles) {
    f->Close();
  }
}